

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O0

int bind_socket(socket_server *ss,request_bind *request,socket_message *result)

{
  int id_00;
  socket *psVar1;
  socket *s;
  int id;
  socket_message *result_local;
  request_bind *request_local;
  socket_server *ss_local;
  
  id_00 = request->id;
  result->id = id_00;
  result->opaque = request->opaque;
  result->ud = 0;
  psVar1 = new_fd(ss,id_00,request->fd,0,request->opaque,true);
  if (psVar1 == (socket *)0x0) {
    result->data = "reach skynet socket number limit";
    ss_local._4_4_ = 4;
  }
  else {
    sp_nonblocking(request->fd);
    psVar1->type = 8;
    result->data = "binding";
    ss_local._4_4_ = 2;
  }
  return ss_local._4_4_;
}

Assistant:

static int
bind_socket(struct socket_server *ss, struct request_bind *request, struct socket_message *result) {
	int id = request->id;
	result->id = id;
	result->opaque = request->opaque;
	result->ud = 0;
	struct socket *s = new_fd(ss, id, request->fd, PROTOCOL_TCP, request->opaque, true);
	if (s == NULL) {
		result->data = "reach skynet socket number limit";
		return SOCKET_ERROR;
	}
	sp_nonblocking(request->fd);
	s->type = SOCKET_TYPE_BIND;
	result->data = "binding";
	return SOCKET_OPEN;
}